

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

void Ivy_FastMapNodeArea2(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,int nLimit)

{
  Ivy_Supp_t *__src;
  char cVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  undefined4 uVar7;
  long lVar8;
  long lVar9;
  Ivy_Supp_t *pSupp;
  char *pcVar10;
  Ivy_Supp_t *pSupp1;
  char *pSupp0;
  int *piVar11;
  long lVar12;
  
  if (0x20 < nLimit) {
    __assert_fail("nLimit <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x17b,"void Ivy_FastMapNodeArea2(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x17c,"void Ivy_FastMapNodeArea2(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  lVar8 = *(long *)((long)pAig->pData + 0x10);
  lVar12 = (long)*(int *)((long)pAig->pData + 8);
  lVar9 = pObj->Id * lVar12;
  if (*(char *)(lVar8 + 1 + lVar9) != '\0') {
    __assert_fail("pSupp->fMark == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x184,"void Ivy_FastMapNodeArea2(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  piVar11 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  piVar6 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  iVar5 = *piVar11;
  iVar3 = *piVar6;
  pSupp = (Ivy_Supp_t *)(lVar9 + lVar8);
  iVar4 = Ivy_FastMapNodeDelay(pAig,pObj);
  sVar2 = pSupp->DelayR;
  if (sVar2 < iVar4) {
    __assert_fail("DelayOld <= pSupp->DelayR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x187,"void Ivy_FastMapNodeArea2(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  pSupp0 = (char *)(iVar5 * lVar12 + lVar8);
  __src = pSupp + 1;
  cVar1 = pSupp->nSize;
  memcpy(Ivy_FastMapNodeArea2::Store,__src,(long)(int)cVar1 * 4);
  if ((1 < piVar11[3]) && (((Ivy_Supp_t *)pSupp0)->Delay < sVar2)) {
    Ivy_FastMapNodeArea2::Supp0[0] = '\x01';
    if (pObj->pFanin0 == (Ivy_Obj_t *)0x0) {
      Ivy_FastMapNodeArea2::Supp0[0xc] = '\0';
      Ivy_FastMapNodeArea2::Supp0[0xd] = '\0';
      Ivy_FastMapNodeArea2::Supp0[0xe] = '\0';
      Ivy_FastMapNodeArea2::Supp0[0xf] = '\0';
    }
    else {
      Ivy_FastMapNodeArea2::Supp0._12_4_ =
           *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    }
    pSupp0 = Ivy_FastMapNodeArea2::Supp0;
  }
  pcVar10 = (char *)(lVar8 + iVar3 * lVar12);
  if ((1 < piVar6[3]) && (((Ivy_Supp_t *)pcVar10)->Delay < sVar2)) {
    Ivy_FastMapNodeArea2::Supp1[0] = '\x01';
    if (pObj->pFanin1 == (Ivy_Obj_t *)0x0) {
      Ivy_FastMapNodeArea2::Supp1[0xc] = '\0';
      Ivy_FastMapNodeArea2::Supp1[0xd] = '\0';
      Ivy_FastMapNodeArea2::Supp1[0xe] = '\0';
      Ivy_FastMapNodeArea2::Supp1[0xf] = '\0';
    }
    else {
      Ivy_FastMapNodeArea2::Supp1._12_4_ =
           *(undefined4 *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    }
    pcVar10 = Ivy_FastMapNodeArea2::Supp1;
  }
  pSupp1 = (Ivy_Supp_t *)pcVar10;
  if (((Ivy_Supp_t *)pSupp0)->nSize < ((Ivy_Supp_t *)pcVar10)->nSize) {
    pSupp1 = (Ivy_Supp_t *)pSupp0;
    pSupp0 = pcVar10;
  }
  Ivy_FastMapNodeArea2::StoreSize = (int)cVar1;
  iVar5 = Ivy_FastMapMerge((Ivy_Supp_t *)pSupp0,pSupp1,pSupp,nLimit);
  if (iVar5 == 0) {
    pSupp->nSize = '\x02';
    iVar5 = 0;
    uVar7 = 0;
    if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
      uVar7 = *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    }
    __src->nSize = (char)uVar7;
    __src->fMark = (char)((uint)uVar7 >> 8);
    __src->fMark2 = (char)((uint)uVar7 >> 0x10);
    __src->fMark3 = (char)((uint)uVar7 >> 0x18);
    if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
      iVar5 = *(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    }
    pSupp[1].nRefs = iVar5;
  }
  iVar5 = Ivy_FastMapNodeDelay(pAig,pObj);
  pSupp->Delay = (short)iVar5;
  if (pSupp->DelayR < (short)iVar5) {
    lVar8 = (long)(char)Ivy_FastMapNodeArea2::StoreSize;
    pSupp->nSize = (char)Ivy_FastMapNodeArea2::StoreSize;
    memcpy(__src,Ivy_FastMapNodeArea2::Store,lVar8 << 2);
    pSupp->Delay = (short)iVar4;
  }
  return;
}

Assistant:

void Ivy_FastMapNodeArea2( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, int nLimit )
{
    static int Store[32], StoreSize;
    static char Supp0[16], Supp1[16];
    static Ivy_Supp_t * pTemp0 = (Ivy_Supp_t *)Supp0;
    static Ivy_Supp_t * pTemp1 = (Ivy_Supp_t *)Supp1;
    Ivy_Obj_t * pFanin0, * pFanin1;
    Ivy_Supp_t * pSupp0, * pSupp1, * pSupp;
    int RetValue, DelayOld;
    assert( nLimit <= 32 );
    assert( Ivy_ObjIsNode(pObj) );
    // get the fanins
    pFanin0 = Ivy_ObjFanin0(pObj);
    pFanin1 = Ivy_ObjFanin1(pObj);
    // get the supports
    pSupp0 = Ivy_ObjSupp( pAig, pFanin0 );
    pSupp1 = Ivy_ObjSupp( pAig, pFanin1 );
    pSupp  = Ivy_ObjSupp( pAig, pObj );
    assert( pSupp->fMark == 0 );
    // get the old delay of the node
    DelayOld = Ivy_FastMapNodeDelay(pAig, pObj);
    assert( DelayOld <= pSupp->DelayR );
    // copy the current cut
    memcpy( Store, pSupp->pArray, sizeof(int) * pSupp->nSize );
    StoreSize = pSupp->nSize;
    // get the fanin support
    if ( Ivy_ObjRefs(pFanin0) > 1 && pSupp0->Delay < pSupp->DelayR )
    {
        pSupp0 = pTemp0;
        pSupp0->nSize = 1;
        pSupp0->pArray[0] = Ivy_ObjFaninId0(pObj);
    }
    // get the fanin support
    if ( Ivy_ObjRefs(pFanin1) > 1 && pSupp1->Delay < pSupp->DelayR )
    {
        pSupp1 = pTemp1;
        pSupp1->nSize = 1;
        pSupp1->pArray[0] = Ivy_ObjFaninId1(pObj);
    }
    // merge the cuts
    if ( pSupp0->nSize < pSupp1->nSize )
        RetValue = Ivy_FastMapMerge( pSupp1, pSupp0, pSupp, nLimit );
    else
        RetValue = Ivy_FastMapMerge( pSupp0, pSupp1, pSupp, nLimit );
    if ( !RetValue )
    {
        pSupp->nSize = 2;
        pSupp->pArray[0] = Ivy_ObjFaninId0(pObj);
        pSupp->pArray[1] = Ivy_ObjFaninId1(pObj);
    }
    // check the resulting delay
    pSupp->Delay = Ivy_FastMapNodeDelay(pAig, pObj);
    if ( pSupp->Delay > pSupp->DelayR )
    {
        pSupp->nSize = StoreSize;
        memcpy( pSupp->pArray, Store, sizeof(int) * pSupp->nSize );
        pSupp->Delay = DelayOld;
    }
}